

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::DynamicObjectPropertyEnumerator::MoveAndGetNext
          (DynamicObjectPropertyEnumerator *this,PropertyId *propertyId,
          PropertyAttributes *attributes)

{
  JavascriptString *pJVar1;
  
  *propertyId = -1;
  if (((this->cachedData).ptr != (CachedData *)0x0) &&
     ((this->initialType).ptr ==
      (DynamicType *)(((this->object).ptr)->super_RecyclableObject).type.ptr)) {
    pJVar1 = MoveAndGetNextWithCache(this,propertyId,attributes);
    return pJVar1;
  }
  if ((this->object).ptr != (DynamicObject *)0x0) {
    (this->cachedData).ptr = (CachedData *)0x0;
    pJVar1 = MoveAndGetNextNoCache(this,propertyId,attributes);
    return pJVar1;
  }
  return (JavascriptString *)0x0;
}

Assistant:

JavascriptString * DynamicObjectPropertyEnumerator::MoveAndGetNext(PropertyId& propertyId, PropertyAttributes * attributes)
    {
        propertyId = Js::Constants::NoProperty;
        if (this->cachedData && this->initialType == this->object->GetDynamicType())
        {
            return MoveAndGetNextWithCache(propertyId, attributes);
        }
        if (this->object)
        {
            // Once enters NoCache path, ensure never switches to Cache path above.
            this->cachedData = nullptr;
            return MoveAndGetNextNoCache(propertyId, attributes);
        }
        return nullptr;
    }